

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::mpsc_queue_traits::impl::combined_lock_t::wait_for_notify(combined_lock_t *this)

{
  bool bVar1;
  undefined1 local_38 [8];
  unique_lock<std::mutex> mlock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stop_point;
  combined_lock_t *this_local;
  
  this->m_waiting = true;
  stop_point.__d.__r = (duration)(duration)this;
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_18 = std::chrono::operator+(&local_20,&this->m_waiting_time);
  do {
    spinlock_t<so_5::yield_backoff_t>::unlock(&this->m_spinlock);
    std::this_thread::yield();
    spinlock_t<so_5::yield_backoff_t>::lock(&this->m_spinlock);
    if ((this->m_signaled & 1U) != 0) {
      this->m_waiting = false;
      this->m_signaled = false;
      return;
    }
    mlock._8_8_ = std::chrono::_V2::system_clock::now();
    bVar1 = std::chrono::operator>
                      (&local_18,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&mlock._M_owns);
  } while (bVar1);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->m_mutex);
  spinlock_t<so_5::yield_backoff_t>::unlock(&this->m_spinlock);
  std::condition_variable::
  wait<so_5::disp::mpsc_queue_traits::impl::combined_lock_t::wait_for_notify()::_lambda()_1_>
            (&this->m_condition,(unique_lock<std::mutex> *)local_38,(anon_class_8_1_8991fb9c)this);
  spinlock_t<so_5::yield_backoff_t>::lock(&this->m_spinlock);
  this->m_waiting = false;
  this->m_signaled = false;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return;
}

Assistant:

SO_5_NOEXCEPT override
			{
				using clock = std::chrono::high_resolution_clock;

				m_waiting = true;
				auto stop_point = clock::now() + m_waiting_time;

				do
					{
						m_spinlock.unlock();

						std::this_thread::yield();

						m_spinlock.lock();

						if( m_signaled )
							{
								m_waiting = false;
								m_signaled = false;
								return;
							}
					}
				while( stop_point > clock::now() );

				// m_lock is locked now.

				// Must use heavy std::mutex and std::condition_variable
				// to allow OS to efficiently use the resources while
				// we are waiting for signal.
				std::unique_lock< std::mutex > mlock( m_mutex );

				m_spinlock.unlock();

				m_condition.wait( mlock, [this]{ return m_signaled; } );

				// At this point m_signaled must be 'true'.

				m_spinlock.lock();

				m_waiting = false;
				m_signaled = false;
			}